

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_add_bulk(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  int iVar1;
  container_t *pcVar2;
  uint8_t uStack_2e;
  uint8_t uStack_2d;
  int iStack_2c;
  
  if ((context->container == (container_t *)0x0) || (val >> 0x10 != (uint)context->key)) {
    pcVar2 = containerptr_roaring_bitmap_add(r,val,&uStack_2d,&iStack_2c);
    context->container = pcVar2;
    context->typecode = uStack_2d;
    context->idx = iStack_2c;
    context->key = (uint16_t)(val >> 0x10);
  }
  else {
    pcVar2 = container_add(context->container,(uint16_t)val,context->typecode,&uStack_2e);
    if (pcVar2 != context->container) {
      container_free(context->container,context->typecode);
      iVar1 = context->idx;
      (r->high_low_container).containers[iVar1] = pcVar2;
      (r->high_low_container).typecodes[iVar1] = uStack_2e;
      context->typecode = uStack_2e;
      context->container = pcVar2;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_bulk(roaring_bitmap_t *r,
                             roaring_bulk_context_t *context, uint32_t val) {
    add_bulk_impl(r, context, val);
}